

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::image_type_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Platform PVar2;
  Dim DVar3;
  size_t sVar4;
  bool bVar5;
  byte bVar6;
  uint32_t uVar7;
  SPIRVariable *pSVar8;
  SPIRType *pSVar9;
  SPIRType *pSVar10;
  CompilerError *pCVar11;
  uint uVar12;
  char (*in_stack_fffffffffffffe58) [2];
  string img_type_name;
  SPIRType img_type_4;
  
  pSVar8 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id);
  if ((pSVar8 != (SPIRVariable *)0x0) && (uVar7 = (pSVar8->basevariable).id, uVar7 != 0)) {
    id = uVar7;
  }
  sVar4 = (type->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar4 != 0) {
    PVar2 = (this->msl_options).platform;
    uVar12 = 20000;
    if (PVar2 == iOS) {
      uVar12 = 0x27d8;
    }
    if ((this->msl_options).msl_version < uVar12) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      if (PVar2 != iOS) {
        ::std::__cxx11::string::string
                  ((string *)&img_type_4,"MSL 2.0 or greater is required for arrays of textures.",
                   (allocator *)&img_type_name);
        CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
        __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string
                ((string *)&img_type_4,"MSL 1.2 or greater is required for arrays of textures.",
                 (allocator *)&img_type_name);
      CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
      __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (sVar4 != 1) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&img_type_4,"Arrays of arrays of textures are not supported in MSL.",
                 (allocator *)&img_type_name);
      CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
      __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    img_type_name._M_dataplus._M_p._0_4_ =
         CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
    if ((uint32_t)img_type_name._M_dataplus._M_p == 0) {
      uVar7 = get_resource_array_size(this,id);
      img_type_name._M_dataplus._M_p._0_4_ = uVar7;
      if (uVar7 == 0) {
        pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&img_type_4,"Unsized array of images is not supported in MSL.",
                   (allocator *)&stack0xfffffffffffffe5f);
        CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
        __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pSVar9 = Compiler::get_pointee_type((Compiler *)this,type);
    pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar9->parent_type).id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
              (&img_type_4,this,pSVar9,(ulong)id);
    join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x3a5098,(char (*) [7])&img_type_4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b2a97,
               (char (*) [3])&img_type_name,(uint *)0x3a4d05,in_stack_fffffffffffffe58);
    pSVar9 = &img_type_4;
    goto LAB_003255e8;
  }
  paVar1 = &img_type_name.field_2;
  img_type_name._M_string_length = 0;
  img_type_name.field_2._M_local_buf[0] = '\0';
  img_type_name._M_dataplus._M_p = (pointer)paVar1;
  pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->super_IVariant).self.id);
  bVar5 = Compiler::is_depth_image((Compiler *)this,type,id);
  DVar3 = (pSVar9->image).dim;
  if (bVar5) {
    switch(DVar3) {
    case Dim1D:
      if ((this->msl_options).texture_1D_as_2D == true) goto switchD_003251df_caseD_1;
      break;
    case Dim2D:
switchD_003251df_caseD_1:
      if ((((pSVar9->image).ms == true) && ((pSVar9->image).arrayed != false)) &&
         ((this->msl_options).msl_version < 0x4e84)) {
        pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&img_type_4,"Multisampled array textures are supported from 2.1.",
                   (allocator *)&stack0xfffffffffffffe5f);
        CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
        __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      break;
    case Dim3D:
      break;
    case DimCube:
    }
    goto LAB_00325462;
  }
  switch(DVar3) {
  case Dim1D:
    if ((this->msl_options).texture_1D_as_2D != false) goto switchD_00325242_caseD_1;
    goto LAB_00325449;
  case Dim2D:
switchD_00325242_caseD_1:
    bVar6 = 0;
    goto LAB_003252c9;
  case Dim3D:
    break;
  case DimCube:
    break;
  default:
    break;
  case DimBuffer:
    if (((pSVar9->image).ms != false) || ((pSVar9->image).arrayed == true)) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&img_type_4,
                 "Cannot use texel buffers with multisampling or array layers.",
                 (allocator *)&stack0xfffffffffffffe5f);
      CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
      __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->msl_options).texture_buffer_native != true) break;
    if ((this->msl_options).msl_version < 0x4e84) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&img_type_4,"Native texture_buffer type is only supported in MSL 2.1.",
                 (allocator *)&stack0xfffffffffffffe5f);
      CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
      __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::assign((char *)&img_type_name);
    goto LAB_0032546c;
  case DimSubpassData:
    bVar6 = 1;
    if ((this->msl_options).multiview == false) {
      bVar6 = (this->msl_options).arrayed_subpass_input;
    }
LAB_003252c9:
    if (((*(int *)&(type->super_IVariant).field_0xc != 0x10) ||
        ((type->image).dim != DimSubpassData)) ||
       ((this->msl_options).use_framebuffer_fetch_subpasses != true)) {
      if ((((pSVar9->image).ms == true) && (((bVar6 | (pSVar9->image).arrayed) & 1) != 0)) &&
         ((this->msl_options).msl_version < 0x4e84)) {
        pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&img_type_4,"Multisampled array textures are supported from 2.1.",
                   (allocator *)&stack0xfffffffffffffe5f);
        CompilerError::CompilerError(pCVar11,(string *)&img_type_4);
        __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_00325449:
      ::std::__cxx11::string::append((char *)&img_type_name);
      goto LAB_0032546c;
    }
    pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar9->image).type.id);
    SPIRType::SPIRType(&img_type_4,pSVar9);
    img_type_4.vecsize = 4;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (__return_storage_ptr__,this,&img_type_4,0);
    SPIRType::~SPIRType(&img_type_4);
    goto LAB_003255e3;
  }
LAB_00325462:
  ::std::__cxx11::string::append((char *)&img_type_name);
LAB_0032546c:
  ::std::__cxx11::string::append((char *)&img_type_name);
  pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar9->image).type.id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&img_type_4,this,pSVar10,0);
  ::std::__cxx11::string::append((string *)&img_type_name);
  ::std::__cxx11::string::~string((string *)&img_type_4);
  if (((*(int *)&(type->super_IVariant).field_0xc == 0x10) && ((type->image).sampled == 2)) &&
     ((type->image).dim != DimSubpassData)) {
    if ((pSVar9->image).access < (AccessQualifierReadWrite|AccessQualifierWriteOnly)) {
      ::std::__cxx11::string::append((char *)&img_type_name);
    }
    else {
      pSVar8 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
      if (((pSVar8 != (SPIRVariable *)0x0) &&
          ((uVar7 = (pSVar8->basevariable).id, uVar7 == 0 ||
           (pSVar8 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,uVar7),
           pSVar8 != (SPIRVariable *)0x0)))) &&
         (bVar5 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,
                             DecorationNonWritable), !bVar5)) {
        ::std::__cxx11::string::append((char *)&img_type_name);
        bVar5 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,
                           DecorationNonReadable);
        if (!bVar5) {
          ::std::__cxx11::string::append((char *)&img_type_name);
        }
        ::std::__cxx11::string::append((char *)&img_type_name);
      }
    }
  }
  ::std::__cxx11::string::append((char *)&img_type_name);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)img_type_name._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(img_type_name.field_2._M_allocated_capacity._1_7_,
                  img_type_name.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = img_type_name.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = img_type_name._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(img_type_name.field_2._M_allocated_capacity._1_7_,
                  img_type_name.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = img_type_name._M_string_length;
  img_type_name._M_string_length = 0;
  img_type_name.field_2._M_local_buf[0] = '\0';
  img_type_name._M_dataplus._M_p = (pointer)paVar1;
LAB_003255e3:
  pSVar9 = (SPIRType *)&img_type_name;
LAB_003255e8:
  ::std::__cxx11::string::~string((string *)pSVar9);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::image_type_glsl(const SPIRType &type, uint32_t id)
{
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
	{
		// For comparison images, check against the base variable,
		// and not the fake ID which might have been generated for this variable.
		id = var->basevariable;
	}

	if (!type.array.empty())
	{
		uint32_t major = 2, minor = 0;
		if (msl_options.is_ios())
		{
			major = 1;
			minor = 2;
		}
		if (!msl_options.supports_msl_version(major, minor))
		{
			if (msl_options.is_ios())
				SPIRV_CROSS_THROW("MSL 1.2 or greater is required for arrays of textures.");
			else
				SPIRV_CROSS_THROW("MSL 2.0 or greater is required for arrays of textures.");
		}

		if (type.array.size() > 1)
			SPIRV_CROSS_THROW("Arrays of arrays of textures are not supported in MSL.");

		// Arrays of images in MSL must be declared with a special array<T, N> syntax ala C++11 std::array.
		// If we have a runtime array, it could be a variable-count descriptor set binding.
		uint32_t array_size = to_array_size_literal(type);
		if (array_size == 0)
			array_size = get_resource_array_size(id);

		if (array_size == 0)
			SPIRV_CROSS_THROW("Unsized array of images is not supported in MSL.");

		auto &parent = get<SPIRType>(get_pointee_type(type).parent_type);
		return join("array<", image_type_glsl(parent, id), ", ", array_size, ">");
	}

	string img_type_name;

	// Bypass pointers because we need the real image struct
	auto &img_type = get<SPIRType>(type.self).image;
	if (is_depth_image(type, id))
	{
		switch (img_type.dim)
		{
		case Dim1D:
		case Dim2D:
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += "depth1d_unsupported_by_metal";
				break;
			}

			if (img_type.ms && img_type.arrayed)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "depth2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "depth2d_ms";
			else if (img_type.arrayed)
				img_type_name += "depth2d_array";
			else
				img_type_name += "depth2d";
			break;
		case Dim3D:
			img_type_name += "depth3d_unsupported_by_metal";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "depthcube_array" : "depthcube");
			else
				img_type_name += (img_type.arrayed ? "depth2d_array" : "depthcube");
			break;
		default:
			img_type_name += "unknown_depth_texture_type";
			break;
		}
	}
	else
	{
		switch (img_type.dim)
		{
		case DimBuffer:
			if (img_type.ms || img_type.arrayed)
				SPIRV_CROSS_THROW("Cannot use texel buffers with multisampling or array layers.");

			if (msl_options.texture_buffer_native)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Native texture_buffer type is only supported in MSL 2.1.");
				img_type_name = "texture_buffer";
			}
			else
				img_type_name += "texture2d";
			break;
		case Dim1D:
		case Dim2D:
		case DimSubpassData:
		{
			bool subpass_array =
			    img_type.dim == DimSubpassData && (msl_options.multiview || msl_options.arrayed_subpass_input);
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += (img_type.arrayed ? "texture1d_array" : "texture1d");
				break;
			}

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			if (type_is_msl_framebuffer_fetch(type))
			{
				auto img_type_4 = get<SPIRType>(img_type.type);
				img_type_4.vecsize = 4;
				return type_to_glsl(img_type_4);
			}
			if (img_type.ms && (img_type.arrayed || subpass_array))
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "texture2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "texture2d_ms";
			else if (img_type.arrayed || subpass_array)
				img_type_name += "texture2d_array";
			else
				img_type_name += "texture2d";
			break;
		}
		case Dim3D:
			img_type_name += "texture3d";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "texturecube_array" : "texturecube");
			else
				img_type_name += (img_type.arrayed ? "texture2d_array" : "texturecube");
			break;
		default:
			img_type_name += "unknown_texture_type";
			break;
		}
	}

	// Append the pixel type
	img_type_name += "<";
	img_type_name += type_to_glsl(get<SPIRType>(img_type.type));

	// For unsampled images, append the sample/read/write access qualifier.
	// For kernel images, the access qualifier my be supplied directly by SPIR-V.
	// Otherwise it may be set based on whether the image is read from or written to within the shader.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2 && type.image.dim != DimSubpassData)
	{
		switch (img_type.access)
		{
		case AccessQualifierReadOnly:
			img_type_name += ", access::read";
			break;

		case AccessQualifierWriteOnly:
			img_type_name += ", access::write";
			break;

		case AccessQualifierReadWrite:
			img_type_name += ", access::read_write";
			break;

		default:
		{
			auto *p_var = maybe_get_backing_variable(id);
			if (p_var && p_var->basevariable)
				p_var = maybe_get<SPIRVariable>(p_var->basevariable);
			if (p_var && !has_decoration(p_var->self, DecorationNonWritable))
			{
				img_type_name += ", access::";

				if (!has_decoration(p_var->self, DecorationNonReadable))
					img_type_name += "read_";

				img_type_name += "write";
			}
			break;
		}
		}
	}

	img_type_name += ">";

	return img_type_name;
}